

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

HFParsingInfo * __thiscall
MlmWrap::createDigitalParsingInfo
          (HFParsingInfo *__return_storage_ptr__,MlmWrap *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels,string *dataformat)

{
  pointer pcVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  bool bVar4;
  int bit;
  ostream *poVar5;
  int iVar6;
  MlmWrap *pMVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  pointer pbVar10;
  string ch;
  string dv;
  vector<int,_std::allocator<int>_> startlengths;
  HFParsingInfo info;
  NDeviceChannel channel;
  undefined1 local_268 [32];
  string local_248;
  vector<int,_std::allocator<int>_> local_228;
  vector<int,_std::allocator<int>_> local_208;
  ulong local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  int local_1d0;
  undefined1 local_1c0 [72];
  string local_178;
  string local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar1 = (dataformat->_M_dataplus)._M_p;
  pMVar7 = (MlmWrap *)local_90;
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pMVar7,pcVar1,pcVar1 + dataformat->_M_string_length);
  bVar4 = verifyTrodesDataFormat(pMVar7,&local_228,(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if (bVar4) {
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c0._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_208,(iterator)0x0,(int *)local_1c0);
    if ((long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      iVar6 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      uVar8 = 0;
      do {
        iVar6 = iVar6 + local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8 + 1];
        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] = iVar6;
        uVar8 = uVar8 + 2;
      } while (uVar8 < (ulong)((long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 2));
    }
    pbVar10 = (channels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (channels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_138 = channels;
    if (pbVar10 != pbVar2) {
      do {
        std::__cxx11::string::find((char *)pbVar10,0x2830ae,0);
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)pbVar10);
        CZHelp::trim_copy(&local_248,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::find((char *)pbVar10,0x2830ae,0);
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)pbVar10);
        CZHelp::trim_copy((string *)local_268,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_248._M_dataplus._M_p,
                   local_248._M_dataplus._M_p + local_248._M_string_length);
        findTrodesDevice((NDevice *)local_1c0,this,&local_158);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        pMVar7 = (MlmWrap *)local_268._0_8_;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_268._0_8_,(pointer)(local_268._0_8_ + local_268._8_8_)
                  );
        findTrodesChannel((NDeviceChannel *)&stack0xffffffffffffff90,pMVar7,(NDevice *)local_1c0,
                          &local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        NDevice::~NDevice((NDevice *)local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        bVar4 = NDeviceChannel::isValid((NDeviceChannel *)&stack0xffffffffffffff90);
        if (!bVar4) {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Could not find ","")
          ;
          error((string *)local_1c0,this,&local_110);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              (char *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),local_1c0._8_8_);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_248._M_dataplus._M_p,local_248._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_268._0_8_,local_268._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", aborting\n",0xb);
          if ((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) != local_1c0 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                            local_1c0._16_8_ + 1);
          }
          _Var9._M_p = local_110._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_001851d1:
            operator_delete(_Var9._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
LAB_001851d9:
          (__return_storage_ptr__->dataRequested).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(undefined8 *)&__return_storage_ptr__->dataLength = 0;
          (__return_storage_ptr__->dataRequested).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->dataRequested).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __return_storage_ptr__->sizeOf = 0;
          (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          NDeviceChannel::~NDeviceChannel((NDeviceChannel *)&stack0xffffffffffffff90);
          if ((MlmWrap *)local_268._0_8_ != (MlmWrap *)(local_268 + 0x10)) {
            operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0018523c;
        }
        iVar6 = NDeviceChannel::getType((NDeviceChannel *)&stack0xffffffffffffff90);
        if (iVar6 != 0) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,local_268._0_8_,
                     (pointer)(local_268._0_8_ + local_268._8_8_));
          error((string *)local_1c0,this,&local_130);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              (char *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),local_1c0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     " is not an digital channel. Stopping and returning empty parsing info\n",0x46)
          ;
          if ((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) != local_1c0 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                            local_1c0._16_8_ + 1);
          }
          local_110.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
          _Var9._M_p = local_130._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) goto LAB_001851d1;
          goto LAB_001851d9;
        }
        iVar6 = NDeviceChannel::getStartByte((NDeviceChannel *)&stack0xffffffffffffff90);
        pMVar7 = (MlmWrap *)&stack0xffffffffffffff90;
        bit = NDeviceChannel::getStartBit((NDeviceChannel *)&stack0xffffffffffffff90);
        calculateDeviceChannelInfoIndices(pMVar7,&local_208,&local_228,iVar6,bit);
        NDeviceChannel::~NDeviceChannel((NDeviceChannel *)&stack0xffffffffffffff90);
        if ((MlmWrap *)local_268._0_8_ != (MlmWrap *)(local_268 + 0x10)) {
          operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != pbVar2);
    }
    pvVar3 = local_138;
    local_1f0 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2 & 0xfffffffffffffffe;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_1e8,local_138);
    local_1d0 = (int)((ulong)((long)(pvVar3->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar3->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 5);
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->sizeOf = local_1f0;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1e8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1e8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1e8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->dataLength = local_1d0;
LAB_0018523c:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Bad data format from Trodes, aborting\n","");
    error((string *)local_1c0,this,&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
               local_1c0._8_8_);
    if ((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) != local_1c0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),local_1c0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&__return_storage_ptr__->dataLength = 0;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->sizeOf = 0;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

HFParsingInfo MlmWrap::createDigitalParsingInfo(std::vector<std::string> channels, std::string dataformat){
    std::vector<int> startlengths;
    if(!verifyTrodesDataFormat(startlengths, dataformat)){
        std::cerr << error("Bad data format from Trodes, aborting\n");
        return HFParsingInfo();
    }

    HFParsingInfo info;
    //Calculate size of digital packet, first item in info.indices
    info.indices.push_back(0);
    for(size_t i = 0; i < startlengths.size(); i+=2){
        info.indices.back() += startlengths[i+1];
    }

    for(auto &channelstr : channels){
        std::string dv = CZHelp::trim_copy(channelstr.substr(0, channelstr.find(",")));
        std::string ch = CZHelp::trim_copy(channelstr.substr(channelstr.find(",")+1));

        //find channel
        NDeviceChannel channel = findTrodesChannel(findTrodesDevice(dv), ch);
        if(!channel.isValid()){
            std::cerr << error("Could not find ") << dv << ", " << ch << ", aborting\n";
            return HFParsingInfo();
        }

        //Checking for being digital
        if(channel.getType() != 0){
            std::cerr << error(ch) << " is not an digital channel. Stopping and returning empty parsing info\n";
            return HFParsingInfo();
        }

        //Push back digital indices, (startbyte, startbit)
        calculateDeviceChannelInfoIndices(info.indices, startlengths, channel.getStartByte(), channel.getStartBit());
    }
    info.sizeOf = (info.indices.size()/2)*sizeof(int16_t);
    info.dataRequested = channels;
    info.dataLength = channels.size();
    return info;
}